

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

int json_print_attrs(lyout *out,int level,lyd_node *node,lys_module *wdmod)

{
  ly_ctx *ctx;
  int iVar1;
  int *piVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  size_t __n;
  char *pcVar5;
  char *pcVar6;
  char *local_68;
  char *p;
  size_t len;
  lyd_attr *attr;
  lys_module *wdmod_local;
  lyd_node *node_local;
  int level_local;
  lyout *out_local;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (wdmod != (lys_module *)0x0) {
    ly_print(out,"%*s\"%s:default\":\"true\"",(ulong)(uint)(level << 1),"",wdmod->name);
    pcVar6 = "";
    if (node->attr != (lyd_attr *)0x0) {
      pcVar6 = ",";
    }
    pcVar5 = "";
    if (level != 0) {
      pcVar5 = "\n";
    }
    ly_print(out,"%s%s",pcVar6,pcVar5);
  }
  len = (size_t)node->attr;
  do {
    if (len == 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 != 0) {
        ctx = node->schema->module->ctx;
        piVar2 = __errno_location();
        pcVar6 = strerror(*piVar2);
        ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar6);
      }
      out_local._4_4_ = (uint)(iVar1 != 0);
      return out_local._4_4_;
    }
    if (*(long *)(len + 0x10) != 0) {
      plVar3 = lys_main_module(*(lys_module **)(*(long *)(len + 0x10) + 0x30));
      plVar4 = lys_main_module(node->schema->module);
      if (plVar3 == plVar4) {
        ly_print(out,"%*s\"%s\":",(ulong)(uint)(level << 1),"",*(undefined8 *)(len + 0x18));
      }
      else {
        ly_print(out,"%*s\"%s:%s\":",(ulong)(uint)(level << 1),"",
                 *(undefined8 *)(*(long *)(*(long *)(len + 0x10) + 0x30) + 8),
                 *(undefined8 *)(len + 0x18));
      }
      switch(*(undefined4 *)(len + 0x30)) {
      case 1:
      case 2:
      case 4:
      case 6:
      case 8:
      case 10:
      case 0x12:
      case 0x13:
        json_print_string(out,*(char **)(len + 0x20));
        break;
      case 3:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
        if (**(char **)(len + 0x20) == '\0') {
          local_68 = "null";
        }
        else {
          local_68 = *(char **)(len + 0x20);
        }
        ly_print(out,"%s",local_68);
        break;
      case 5:
        ly_print(out,"[null]");
        break;
      case 7:
        pcVar6 = strchr(*(char **)(len + 0x20),0x3a);
        if (pcVar6 == (char *)0x0) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
                        ,0x73,
                        "int json_print_attrs(struct lyout *, int, const struct lyd_node *, const struct lys_module *)"
                       );
        }
        __n = (long)pcVar6 - *(long *)(len + 0x20);
        iVar1 = strncmp(*(char **)(len + 0x20),
                        *(char **)(*(long *)(*(long *)(len + 0x10) + 0x30) + 8),__n);
        if ((iVar1 == 0) &&
           (*(char *)(*(long *)(*(long *)(*(long *)(len + 0x10) + 0x30) + 8) + __n) == '\0')) {
          json_print_string(out,pcVar6 + 1);
        }
        else {
          json_print_string(out,*(char **)(len + 0x20));
        }
        break;
      default:
        ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
               ,0x84);
        return 1;
      }
      pcVar6 = "";
      if (*(long *)(len + 8) != 0) {
        pcVar6 = ",";
      }
      pcVar5 = "";
      if (level != 0) {
        pcVar5 = "\n";
      }
      ly_print(out,"%s%s",pcVar6,pcVar5);
    }
    len = *(size_t *)(len + 8);
  } while( true );
}

Assistant:

static int
json_print_attrs(struct lyout *out, int level, const struct lyd_node *node, const struct lys_module *wdmod)
{
    struct lyd_attr *attr;
    size_t len;
    char *p;

    LY_PRINT_SET;

    if (wdmod) {
        ly_print(out, "%*s\"%s:default\":\"true\"", LEVEL, INDENT, wdmod->name);
        ly_print(out, "%s%s", node->attr ? "," : "", (level ? "\n" : ""));
    }
    for (attr = node->attr; attr; attr = attr->next) {
        if (!attr->annotation) {
            /* skip exception for the NETCONF's attribute since JSON is not defined for NETCONF */
            continue;
        }
        if (lys_main_module(attr->annotation->module) != lys_main_module(node->schema->module)) {
            ly_print(out, "%*s\"%s:%s\":", LEVEL, INDENT, attr->annotation->module->name, attr->name);
        } else {
            ly_print(out, "%*s\"%s\":", LEVEL, INDENT, attr->name);
        }
        /* leafref is not supported */
        switch (attr->value_type) {
        case LY_TYPE_BINARY:
        case LY_TYPE_STRING:
        case LY_TYPE_BITS:
        case LY_TYPE_ENUM:
        case LY_TYPE_INST:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT64:
        case LY_TYPE_DEC64:
            json_print_string(out, attr->value_str);
            break;

        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_BOOL:
            ly_print(out, "%s", attr->value_str[0] ? attr->value_str : "null");
            break;

        case LY_TYPE_IDENT:
            p = strchr(attr->value_str, ':');
            assert(p);
            len = p - attr->value_str;
            if (!strncmp(attr->value_str, attr->annotation->module->name, len)
                    && !attr->annotation->module->name[len]) {
                /* do not print the prefix, it is the default prefix for this node */
                json_print_string(out, ++p);
            } else {
                json_print_string(out, attr->value_str);
            }
            break;

        case LY_TYPE_EMPTY:
            ly_print(out, "[null]");
            break;

        default:
            /* error */
            LOGINT(node->schema->module->ctx);
            return EXIT_FAILURE;
        }

        ly_print(out, "%s%s", attr->next ? "," : "", (level ? "\n" : ""));
    }

    LY_PRINT_RET(node->schema->module->ctx);
}